

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O3

PrimInfo * __thiscall
embree::avx512::PointsISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,PointsISA *this,PrimRef *prims,range<unsigned_long> *r,
          size_t k,uint geomID)

{
  BufferView<embree::Vec3fx> *pBVar1;
  char *pcVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  uint index;
  ulong uVar11;
  long lVar12;
  unsigned_long uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  undefined1 auVar20 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar15 [64];
  undefined1 auVar17 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar11 = r->_begin;
  uVar13 = r->_end;
  if (uVar11 < uVar13) {
    auVar14._8_4_ = 0xff800000;
    auVar14._0_8_ = 0xff800000ff800000;
    auVar14._12_4_ = 0xff800000;
    auVar15 = ZEXT1664(auVar14);
    auVar16._8_4_ = 0x7f800000;
    auVar16._0_8_ = 0x7f8000007f800000;
    auVar16._12_4_ = 0x7f800000;
    auVar17 = ZEXT1664(auVar16);
    sVar8 = 0;
    auVar24._8_4_ = 0xddccb9a2;
    auVar24._0_8_ = 0xddccb9a2ddccb9a2;
    auVar24._12_4_ = 0xddccb9a2;
    auVar25._8_4_ = 0x5dccb9a2;
    auVar25._0_8_ = 0x5dccb9a25dccb9a2;
    auVar25._12_4_ = 0x5dccb9a2;
    auVar20 = ZEXT1664(auVar16);
    auVar23 = ZEXT1664(auVar14);
    do {
      pBVar1 = (this->super_Points).vertices.items;
      sVar9 = k;
      if ((uVar11 & 0xffffffff) < (pBVar1->super_RawBufferView).num) {
        lVar10 = (uVar11 & 0xffffffff) * (pBVar1->super_RawBufferView).stride;
        pcVar2 = (pBVar1->super_RawBufferView).ptr_ofs;
        auVar14 = *(undefined1 (*) [16])(pcVar2 + lVar10);
        uVar6 = vcmpps_avx512vl(auVar14,auVar24,6);
        uVar7 = vcmpps_avx512vl(auVar14,auVar25,1);
        if (((byte)((byte)uVar6 & (byte)uVar7) == 0xf) && (0.0 <= *(float *)(pcVar2 + lVar10 + 0xc))
           ) {
          lVar10 = *(long *)&(this->super_Points).super_Geometry.field_0x58;
          lVar12 = *(long *)&(this->super_Points).field_0x68 * uVar11;
          auVar14 = *(undefined1 (*) [16])(lVar10 + lVar12);
          fVar5 = *(float *)(lVar10 + 0xc + lVar12) * (this->super_Points).maxRadiusScale;
          auVar27._4_4_ = fVar5;
          auVar27._0_4_ = fVar5;
          auVar27._8_4_ = fVar5;
          auVar27._12_4_ = fVar5;
          auVar16 = vsubps_avx(auVar14,auVar27);
          aVar3 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar16,ZEXT416(geomID),0x30);
          auVar26._0_4_ = auVar14._0_4_ + fVar5;
          auVar26._4_4_ = auVar14._4_4_ + fVar5;
          auVar26._8_4_ = auVar14._8_4_ + fVar5;
          auVar26._12_4_ = auVar14._12_4_ + fVar5;
          aVar4 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar26,ZEXT416((uint)uVar11),0x30);
          auVar14 = vminps_avx(auVar17._0_16_,(undefined1  [16])aVar3);
          auVar17 = ZEXT1664(auVar14);
          auVar14 = vmaxps_avx(auVar15._0_16_,(undefined1  [16])aVar4);
          auVar15 = ZEXT1664(auVar14);
          auVar28._0_4_ = aVar3.x + aVar4.x;
          auVar28._4_4_ = aVar3.y + aVar4.y;
          auVar28._8_4_ = aVar3.z + aVar4.z;
          auVar28._12_4_ = aVar3.field_3.w + aVar4.field_3.w;
          auVar14 = vminps_avx(auVar20._0_16_,auVar28);
          auVar20 = ZEXT1664(auVar14);
          auVar14 = vmaxps_avx(auVar23._0_16_,auVar28);
          auVar23 = ZEXT1664(auVar14);
          sVar8 = sVar8 + 1;
          sVar9 = k + 1;
          prims[k].upper.field_0.field_1 = aVar4;
          prims[k].lower.field_0.field_1 = aVar3;
          uVar13 = r->_end;
        }
      }
      aVar21 = auVar23._0_16_;
      aVar18 = auVar20._0_16_;
      aVar22 = auVar15._0_16_;
      aVar19 = auVar17._0_16_;
      uVar11 = uVar11 + 1;
      k = sVar9;
    } while (uVar11 < uVar13);
  }
  else {
    aVar19.m128[2] = INFINITY;
    aVar19._0_8_ = 0x7f8000007f800000;
    aVar19.m128[3] = INFINITY;
    aVar22.m128[2] = -INFINITY;
    aVar22._0_8_ = 0xff800000ff800000;
    aVar22.m128[3] = -INFINITY;
    sVar8 = 0;
    aVar18 = aVar19;
    aVar21 = aVar22;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar19;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar22;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar18;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar21;
  __return_storage_ptr__->end = sVar8;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          BBox3fa bounds = empty;
          if (!buildBounds(j, &bounds))
            continue;
          const PrimRef prim(bounds, geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }